

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::
removeMemoryLeakInformationWithoutCheckingOrDeallocatingTheMemoryButDeallocatingTheAccountInformation
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,void *memory,
          bool allocatNodesSeperately)

{
  byte bVar1;
  MemoryLeakDetectorNode *pMVar2;
  byte in_CL;
  long *in_RSI;
  MemoryLeakDetectorNode *node;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  pMVar2 = MemoryLeakDetectorTable::removeNode
                     ((MemoryLeakDetectorTable *)
                      (CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
                      in_stack_ffffffffffffffd8);
  if ((bVar1 & 1) != 0) {
    (**(code **)(*in_RSI + 0x48))(in_RSI,pMVar2);
  }
  return;
}

Assistant:

void MemoryLeakDetector::removeMemoryLeakInformationWithoutCheckingOrDeallocatingTheMemoryButDeallocatingTheAccountInformation(TestMemoryAllocator* allocator, void* memory, bool allocatNodesSeperately)
{
    MemoryLeakDetectorNode* node = memoryTable_.removeNode((char*) memory);
    if (allocatNodesSeperately) allocator->freeMemoryLeakNode( (char*) node);
}